

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O2

weak_count * __thiscall boost::detail::weak_count::operator=(weak_count *this,shared_count *r)

{
  sp_counted_base *psVar1;
  sp_counted_base *this_00;
  
  psVar1 = r->pi_;
  this_00 = this->pi_;
  if (psVar1 != this_00) {
    if (psVar1 != (sp_counted_base *)0x0) {
      LOCK();
      psVar1->weak_count_ = psVar1->weak_count_ + 1;
      UNLOCK();
      this_00 = this->pi_;
    }
    if (this_00 != (sp_counted_base *)0x0) {
      sp_counted_base::weak_release(this_00);
    }
    this->pi_ = psVar1;
  }
  return this;
}

Assistant:

weak_count & operator= (shared_count const & r) // nothrow
    {
        sp_counted_base * tmp = r.pi_;

        if( tmp != pi_ )
        {
            if(tmp != 0) tmp->weak_add_ref();
            if(pi_ != 0) pi_->weak_release();
            pi_ = tmp;
        }

        return *this;
    }